

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# touzet_baseline_tree_index_impl.h
# Opt level: O2

double __thiscall
ted::TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>::
ted_k(TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
      *this,TreeIndexAll *t1,TreeIndexAll *t2,int k)

{
  BandMatrix<double> *this_00;
  uint t1_size;
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  double *pdVar5;
  int iVar6;
  ulong uVar7;
  ulong col;
  int iVar8;
  ulong row;
  double dVar9;
  double extraout_XMM0_Qa;
  
  t1_size = (t1->super_Constants).tree_size_;
  iVar8 = (t2->super_Constants).tree_size_;
  TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>::
  init_matrices(&this->
                 super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                ,t1_size,k);
  (this->
  super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>).
  super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>.
  subproblem_counter_ = 0;
  iVar2 = t1_size - iVar8;
  iVar6 = -iVar2;
  if (0 < iVar2) {
    iVar6 = iVar2;
  }
  if (k < iVar6) {
    dVar9 = INFINITY;
  }
  else {
    iVar8 = iVar8 + -1;
    this_00 = &(this->
               super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
               ).td_;
    uVar3 = -k;
    row = 0;
    uVar7 = (ulong)t1_size;
    if ((int)t1_size < 1) {
      uVar7 = row;
    }
    for (; row != uVar7; row = row + 1) {
      col = 0;
      if (0 < (int)uVar3) {
        col = (ulong)uVar3;
      }
      iVar6 = (int)row;
      iVar2 = k + iVar6;
      if (iVar8 < k + iVar6) {
        iVar2 = iVar8;
      }
      for (; (long)col <= (long)iVar2; col = col + 1) {
        bVar1 = TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                ::k_relevant(&this->
                              super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                             ,t1,t2,iVar6,(int)col,k);
        if (bVar1) {
          iVar4 = TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                  ::e_budget(&this->
                              super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                             ,t1,t2,iVar6,(int)col,k);
          (*(this->
            super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
            ).
            super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>.
            _vptr_TEDAlgorithm[2])
                    (this,t1,t2,row & 0xffffffff,col & 0xffffffff,(ulong)(uint)k,iVar4);
          pdVar5 = data_structures::BandMatrix<double>::at(this_00,row,col);
          *pdVar5 = extraout_XMM0_Qa;
        }
      }
      uVar3 = uVar3 + 1;
    }
    pdVar5 = data_structures::BandMatrix<double>::at
                       (this_00,(long)(t1->super_Constants).tree_size_ - 1,
                        (long)(t2->super_Constants).tree_size_ - 1);
    dVar9 = *pdVar5;
  }
  return dVar9;
}

Assistant:

double TouzetBaselineTreeIndex<CostModel, TreeIndex>::ted_k(const TreeIndex& t1,
    const TreeIndex& t2, const int k) {
  
  const int t1_size = t1.tree_size_;
  const int t2_size = t2.tree_size_;

  init_matrices(t1_size, k);
  
  // Reset subproblem counter.
  subproblem_counter_ = 0;

  // If the pair of root nodes is not in k-strip (input tree size difference is
  // greater than k), return infinity.
  if (std::abs(t1_size - t2_size) > k) {
    return std::numeric_limits<double>::infinity();
  }
  
  // Nested loop over all node pairs in k-strip : |x-y|<=k. This loop iterates
  // over all node pairs from k-strip, and verifies their k-relevancy.
  for (int x = 0; x < t1_size; ++x) {
    for (int y = std::max(0, x - k); y <= std::min(x + k, t2_size-1); ++y) {
      if (k_relevant(t1, t2, x, y, k)) {
        // Compute td(x, y) with e errors - the value of e(x, y, k).
        td_.at(x, y) = tree_dist(t1, t2, x, y, k, e_budget(t1, t2, x, y, k));
      }
    }
  }
  
  return td_.at(t1.tree_size_-1, t2.tree_size_-1);
}